

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

_Bool do_end_block_check(block_split_stats *stats,u32 block_length)

{
  uint uVar1;
  uint uVar2;
  uint in_ESI;
  block_split_stats *in_RDI;
  u32 delta;
  u32 actual;
  u32 expected;
  int i;
  u32 cutoff;
  u32 num_items;
  u32 total_delta;
  int local_34;
  int local_24;
  uint local_20;
  int local_18;
  
  if (in_RDI->num_observations != 0) {
    local_18 = 0;
    for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
      uVar1 = in_RDI->observations[local_24] * in_RDI->num_new_observations;
      uVar2 = in_RDI->new_observations[local_24] * in_RDI->num_observations;
      if (uVar1 < uVar2) {
        local_34 = uVar2 - uVar1;
      }
      else {
        local_34 = uVar1 - uVar2;
      }
      local_18 = local_34 + local_18;
    }
    uVar1 = in_RDI->num_observations + in_RDI->num_new_observations;
    local_20 = (in_RDI->num_new_observations * 200 >> 9) * in_RDI->num_observations;
    if ((in_ESI < 10000) && (uVar1 < 0x2000)) {
      local_20 = local_20 + (int)((ulong)local_20 * (ulong)(0x2000 - uVar1) >> 0xd);
    }
    if (local_20 <= local_18 + (in_ESI >> 0xc) * in_RDI->num_observations) {
      return true;
    }
  }
  merge_new_observations(in_RDI);
  return false;
}

Assistant:

static bool
do_end_block_check(struct block_split_stats *stats, u32 block_length)
{
	if (stats->num_observations > 0) {
		/*
		 * Compute the sum of absolute differences of probabilities.  To
		 * avoid needing to use floating point arithmetic or do slow
		 * divisions, we do all arithmetic with the probabilities
		 * multiplied by num_observations * num_new_observations.  E.g.,
		 * for the "old" observations the probabilities would be
		 * (double)observations[i] / num_observations, but since we
		 * multiply by both num_observations and num_new_observations we
		 * really do observations[i] * num_new_observations.
		 */
		u32 total_delta = 0;
		u32 num_items;
		u32 cutoff;
		int i;

		for (i = 0; i < NUM_OBSERVATION_TYPES; i++) {
			u32 expected = stats->observations[i] *
				       stats->num_new_observations;
			u32 actual = stats->new_observations[i] *
				     stats->num_observations;
			u32 delta = (actual > expected) ? actual - expected :
							  expected - actual;

			total_delta += delta;
		}

		num_items = stats->num_observations +
			    stats->num_new_observations;
		/*
		 * Heuristic: the cutoff is when the sum of absolute differences
		 * of probabilities becomes at least 200/512.  As above, the
		 * probability is multiplied by both num_new_observations and
		 * num_observations.  Be careful to avoid integer overflow.
		 */
		cutoff = stats->num_new_observations * 200 / 512 *
			 stats->num_observations;
		/*
		 * Very short blocks have a lot of overhead for the Huffman
		 * codes, so only use them if it clearly seems worthwhile.
		 * (This is an additional penalty, which adds to the smaller
		 * penalty below which scales more slowly.)
		 */
		if (block_length < 10000 && num_items < 8192)
			cutoff += (u64)cutoff * (8192 - num_items) / 8192;

		/* Ready to end the block? */
		if (total_delta +
		    (block_length / 4096) * stats->num_observations >= cutoff)
			return true;
	}
	merge_new_observations(stats);
	return false;
}